

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_CreateFanout(Vec_Wec_t *vFanins,Vec_Wec_t *vFanouts)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int local_28;
  int Fanin;
  int k;
  int i;
  Vec_Int_t *vArray;
  Vec_Wec_t *vFanouts_local;
  Vec_Wec_t *vFanins_local;
  
  iVar1 = Vec_WecSize(vFanins);
  Vec_WecInit(vFanouts,iVar1);
  for (Fanin = 0; iVar1 = Vec_WecSize(vFanins), Fanin < iVar1; Fanin = Fanin + 1) {
    pVVar3 = Vec_WecEntry(vFanins,Fanin);
    for (local_28 = 0; iVar1 = Vec_IntSize(pVVar3), local_28 < iVar1; local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(pVVar3,local_28);
      pVVar4 = Vec_WecEntry(vFanouts,iVar1);
      pVVar4->nSize = pVVar4->nSize + 1;
    }
  }
  for (Fanin = 0; iVar1 = Vec_WecSize(vFanouts), Fanin < iVar1; Fanin = Fanin + 1) {
    pVVar3 = Vec_WecEntry(vFanouts,Fanin);
    iVar1 = pVVar3->nSize;
    pVVar3->nSize = 0;
    Vec_IntGrow(pVVar3,iVar1);
  }
  for (Fanin = 0; iVar1 = Vec_WecSize(vFanins), Fanin < iVar1; Fanin = Fanin + 1) {
    pVVar3 = Vec_WecEntry(vFanins,Fanin);
    for (local_28 = 0; iVar1 = Vec_IntSize(pVVar3), local_28 < iVar1; local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(pVVar3,local_28);
      pVVar4 = Vec_WecEntry(vFanouts,iVar1);
      Vec_IntPush(pVVar4,Fanin);
    }
  }
  Fanin = 0;
  while( true ) {
    iVar1 = Vec_WecSize(vFanouts);
    if (iVar1 <= Fanin) {
      return;
    }
    pVVar3 = Vec_WecEntry(vFanouts,Fanin);
    iVar1 = Vec_IntSize(pVVar3);
    iVar2 = Vec_IntCap(pVVar3);
    if (iVar1 != iVar2) break;
    Fanin = Fanin + 1;
  }
  __assert_fail("Vec_IntSize(vArray) == Vec_IntCap(vArray)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x61,"void Sfm_CreateFanout(Vec_Wec_t *, Vec_Wec_t *)");
}

Assistant:

void Sfm_CreateFanout( Vec_Wec_t * vFanins, Vec_Wec_t * vFanouts )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // count fanouts
    Vec_WecInit( vFanouts, Vec_WecSize(vFanins) );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_WecEntry( vFanouts, Fanin )->nSize++;
    // allocate fanins
    Vec_WecForEachLevel( vFanouts, vArray, i )
    {
        k = vArray->nSize; vArray->nSize = 0;
        Vec_IntGrow( vArray, k );
    }
    // add fanouts
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_IntPush( Vec_WecEntry( vFanouts, Fanin ), i );
    // verify
    Vec_WecForEachLevel( vFanouts, vArray, i )
        assert( Vec_IntSize(vArray) == Vec_IntCap(vArray) );
}